

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::RgbToBgr(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
                   uint32_t startYOut,uint32_t width,uint32_t height,SIMDType simdType)

{
  uint8_t *puVar1;
  uint8_t *outYEnd;
  uint8_t *puVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  SIMDType SVar6;
  SIMDType SVar7;
  uint uVar8;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  uint uVar9;
  uint uVar10;
  uint8_t *inY;
  uint8_t *outY;
  uint uVar11;
  uint8_t *puVar12;
  long lVar13;
  uint8_t *puVar14;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  uVar3 = width * 3;
  SVar6 = simdType;
  do {
    SVar7 = SVar6;
    if (SVar7 != avx_function) {
      if (SVar7 - sse_function < 2) {
        uVar8 = 0x10;
      }
      else {
        if (SVar7 == cpu_function) goto LAB_00125839;
        uVar8 = 0;
      }
      uVar9 = 8;
      if (SVar7 != neon_function) {
        uVar9 = uVar8;
      }
      if (uVar3 < uVar9) {
LAB_00125839:
        Image_Function::RgbToBgr(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
        return;
      }
      goto LAB_00125850;
    }
    SVar6 = sse_function;
  } while (uVar3 < 0x20);
  uVar9 = 0x20;
LAB_00125850:
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_80._data = (uchar *)0x0;
  local_80._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_80,(EVP_PKEY_CTX *)out,src);
  Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyRGBImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_80);
  local_80._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_80);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  width = uVar3;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src_00);
  Image_Function::
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  auVar5 = _DAT_001db510;
  uVar3 = out->_rowSize;
  uVar8 = in->_rowSize;
  inY = in->_data + (ulong)(startXIn * 3) + (ulong)(startYIn * uVar8);
  outY = out->_data + (ulong)(startXOut * 3) + (ulong)(startYOut * uVar3);
  outYEnd = outY + height * uVar3;
  uVar10 = (uint)(byte)((char)uVar9 + (char)(uVar9 * 0x56 >> 8) * -3);
  uVar9 = uVar9 - uVar10;
  uVar11 = 0;
  if (width % uVar9 < uVar10) {
    uVar11 = uVar9;
  }
  uVar11 = uVar11 + width % uVar9;
  if (SVar7 == avx_function) {
    avx::RgbToBgr(outY,inY,outYEnd,uVar3,uVar8,'\x03',uVar9,width - uVar11,uVar11);
  }
  else if ((SVar7 == sse_function) && (height * uVar3 != 0)) {
    do {
      puVar2 = outY + (width - uVar11);
      puVar12 = outY;
      puVar14 = inY;
      if (width != uVar11) {
        lVar13 = 0;
        do {
          auVar4 = vpshufb_avx(*(undefined1 (*) [16])(inY + lVar13),auVar5);
          *(undefined1 (*) [16])(outY + lVar13) = auVar4;
          lVar13 = lVar13 + (ulong)uVar9;
        } while (outY + lVar13 != puVar2);
        puVar14 = inY + lVar13;
        puVar12 = puVar2;
      }
      if (uVar11 != 0) {
        for (; puVar12 != puVar2 + uVar11; puVar12 = puVar12 + 3) {
          puVar12[2] = *puVar14;
          puVar12[1] = puVar14[1];
          puVar1 = puVar14 + 2;
          puVar14 = puVar14 + 3;
          *puVar12 = *puVar1;
        }
      }
      outY = outY + uVar3;
      inY = inY + uVar8;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void RgbToBgr( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                   uint32_t width, uint32_t height, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        const uint8_t colorCount = RGB;

        if( (simdType == cpu_function) || ((width * colorCount) < simdSize) ) {
            AVX_CODE( RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height, sse_function ); )

            Image_Function::RgbToBgr( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyRGBImage     ( in, out );
        width = width * colorCount;

        Image_Function::OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        const uint32_t rgbSimdSize = (simdSize / colorCount) * colorCount;
        const uint32_t simdWidth = width / rgbSimdSize;
        uint32_t totalSimdWidth = simdWidth * rgbSimdSize;
        uint32_t nonSimdWidth = width - totalSimdWidth;

        // to prevent unallowed access to memory
        if( nonSimdWidth < (simdSize % colorCount) ) {
            totalSimdWidth -= rgbSimdSize;
            nonSimdWidth += rgbSimdSize;
        }

        AVX_CODE( avx::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        SSSE3_CODE( sse::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
        NEON_CODE( neon::RgbToBgr( outY, inY, outYEnd, rowSizeOut, rowSizeIn, colorCount, rgbSimdSize, totalSimdWidth, nonSimdWidth ); )
    }